

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

void ply_reverse(void *anydata,size_t size)

{
  undefined1 uVar1;
  size_t i;
  char temp;
  char *data;
  size_t size_local;
  void *anydata_local;
  
  for (i = 0; i < size >> 1; i = i + 1) {
    uVar1 = *(undefined1 *)((long)anydata + i);
    *(undefined1 *)((long)anydata + i) = *(undefined1 *)((long)anydata + (size - i) + -1);
    *(undefined1 *)((long)anydata + (size - i) + -1) = uVar1;
  }
  return;
}

Assistant:

static void ply_reverse(void *anydata, size_t size) {
    char *data = (char *)anydata;
    char temp;
    size_t i;
    for (i = 0; i < size / 2; i++) {
        temp = data[i];
        data[i] = data[size - i - 1];
        data[size - i - 1] = temp;
    }
}